

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

XThreadEvent ** __thiscall
kj::Vector<kj::_::XThreadEvent*>::add<kj::_::XThreadEvent*>
          (Vector<kj::_::XThreadEvent*> *this,XThreadEvent **params)

{
  XThreadEvent **ppXVar1;
  undefined8 *puVar2;
  
  puVar2 = *(undefined8 **)(this + 8);
  if (puVar2 == *(undefined8 **)(this + 0x10)) {
    Vector<kj::_::XThreadEvent_*>::grow((Vector<kj::_::XThreadEvent_*> *)this,0);
    puVar2 = *(undefined8 **)(this + 8);
  }
  *puVar2 = *params;
  ppXVar1 = *(XThreadEvent ***)(this + 8);
  *(XThreadEvent ***)(this + 8) = ppXVar1 + 1;
  return ppXVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }